

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O3

bool midi_processor::process_riff_midi_count
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,size_t *track_count)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  *track_count = 0;
  puVar5 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)*(uint *)(puVar5 + 4) != 4) {
    puVar4 = puVar5 + (ulong)*(uint *)(puVar5 + 4) + 8;
    puVar5 = puVar5 + 0xc;
    do {
      if ((long)puVar4 - (long)puVar5 < 8) {
        return false;
      }
      uVar7 = (ulong)((uint)*(ushort *)(puVar5 + 6) << 0x10 | (uint)puVar5[5] << 8 | (uint)puVar5[4]
                     );
      if ((ulong)((long)puVar4 - (long)puVar5) < uVar7) {
        return false;
      }
      if (*puVar5 == 'd') {
        uVar6 = 0xffffffffffffffff;
        do {
          if (uVar6 == 2) goto LAB_00110d65;
          lVar1 = uVar6 + 2;
          lVar2 = uVar6 + 2;
          uVar6 = uVar6 + 1;
        } while ((uint)puVar5[lVar1] == (int)"data"[lVar2]);
        if (2 < uVar6) {
LAB_00110d65:
          local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,puVar5 + 8,
                     puVar5 + uVar7 + 8);
          bVar3 = process_standard_midi_count(&local_28,track_count);
          if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_28.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_28.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            return bVar3;
          }
          return bVar3;
        }
      }
      puVar5 = puVar5 + uVar7 + (puVar5 + uVar7 != puVar4 & puVar5[4]);
    } while (puVar5 != puVar4);
  }
  return false;
}

Assistant:

bool midi_processor::process_riff_midi_count( std::vector<uint8_t> const& p_file, size_t & track_count )
{
    track_count = 0;

    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = it[ 4 ] | ( it[ 5 ] << 8 ) | ( it[ 6 ] << 16 ) | ( it[ 7 ] << 24 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal(it, "data", 4) )
        {
            std::vector<uint8_t> midi_file;
            midi_file.assign( it + 8, it + 8 + chunk_size );
            return process_standard_midi_count( midi_file, track_count );
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
    }

    return false;
}